

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall ncnn::BinaryOp::forward_inplace(BinaryOp *this,Mat *bottom_top_blob)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  
  switch(this->op_type) {
  case 0:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar6 + uVar8 * 4) = *(float *)((long)pvVar6 + uVar8 * 4) + fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 1:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar6 + uVar8 * 4) = *(float *)((long)pvVar6 + uVar8 * 4) - fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 2:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar6 + uVar8 * 4) = *(float *)((long)pvVar6 + uVar8 * 4) * fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 3:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      fVar1 = this->b;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar6 + uVar8 * 4) =
                 *(float *)((long)pvVar6 + uVar8 * 4) * (1.0 / fVar1);
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 4:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            fVar9 = *(float *)((long)pvVar6 + uVar8 * 4);
            if (fVar9 <= fVar1) {
              fVar9 = fVar1;
            }
            *(float *)((long)pvVar6 + uVar8 * 4) = fVar9;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 5:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            fVar9 = *(float *)((long)pvVar6 + uVar8 * 4);
            if (fVar1 <= fVar9) {
              fVar9 = fVar1;
            }
            *(float *)((long)pvVar6 + uVar8 * 4) = fVar9;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 6:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            fVar9 = powf(*(float *)((long)pvVar6 + uVar8 * 4),fVar1);
            *(float *)((long)pvVar6 + uVar8 * 4) = fVar9;
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 7:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar6 + uVar8 * 4) = fVar1 - *(float *)((long)pvVar6 + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
    break;
  case 8:
    iVar2 = bottom_top_blob->c;
    if (0 < (long)iVar2) {
      fVar1 = this->b;
      uVar5 = bottom_top_blob->w * bottom_top_blob->h;
      pvVar6 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      lVar7 = 0;
      do {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar6 + uVar8 * 4) = fVar1 / *(float *)((long)pvVar6 + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        lVar7 = lVar7 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
      } while (lVar7 != iVar2);
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward_inplace(Mat& bottom_top_blob) const
{
    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace< std::plus<float> >(bottom_top_blob, b);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace< std::minus<float> >(bottom_top_blob, b);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace< std::multiplies<float> >(bottom_top_blob, b);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace< std::divides<float> >(bottom_top_blob, b);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace< binary_op_max<float> >(bottom_top_blob, b);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace< binary_op_min<float> >(bottom_top_blob, b);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace< binary_op_pow<float> >(bottom_top_blob, b);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace< binary_op_rsub<float> >(bottom_top_blob, b);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace< binary_op_rdiv<float> >(bottom_top_blob, b);

    return 0;
}